

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSweep.c
# Opt level: O0

void Dch_ManSweepNode(Dch_Man_t *p,Aig_Obj_t *pObj)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *p_00;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  int RetValue;
  Aig_Obj_t *pObjReprFraig;
  Aig_Obj_t *pObjFraig2;
  Aig_Obj_t *pObjFraig;
  Aig_Obj_t *pObjRepr;
  Aig_Obj_t *pObj_local;
  Dch_Man_t *p_local;
  
  pObj_00 = Aig_ObjRepr(p->pAigTotal,pObj);
  if (((pObj_00 != (Aig_Obj_t *)0x0) && (pAVar2 = Dch_ObjFraig(pObj), pAVar2 != (Aig_Obj_t *)0x0))
     && (p_00 = Dch_ObjFraig(pObj_00), p_00 != (Aig_Obj_t *)0x0)) {
    pAVar3 = Aig_Regular(pAVar2);
    pAVar4 = Aig_Regular(p_00);
    if (pAVar3 == pAVar4) {
      p->pReprsProved[pObj->Id] = pObj_00;
    }
    else {
      pAVar3 = Aig_Regular(pAVar2);
      pAVar4 = Aig_ManConst1(p->pAigFraig);
      if (pAVar3 == pAVar4) {
        __assert_fail("Aig_Regular(pObjFraig) != Aig_ManConst1(p->pAigFraig)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchSweep.c"
                      ,0x48,"void Dch_ManSweepNode(Dch_Man_t *, Aig_Obj_t *)");
      }
      pAVar3 = Aig_Regular(p_00);
      pAVar2 = Aig_Regular(pAVar2);
      iVar1 = Dch_NodesAreEquiv(p,pAVar3,pAVar2);
      if (iVar1 == -1) {
        Dch_ObjSetFraig(pObj,(Aig_Obj_t *)0x0);
      }
      else if (iVar1 == 1) {
        pAVar2 = Aig_NotCond(p_00,(uint)(*(ulong *)&pObj->field_0x18 >> 3) & 1 ^
                                  (uint)(*(ulong *)&pObj_00->field_0x18 >> 3) & 1);
        Dch_ObjSetFraig(pObj,pAVar2);
        p->pReprsProved[pObj->Id] = pObj_00;
      }
      else {
        if (p->pPars->fSimulateTfo == 0) {
          Dch_ManResimulateCex2(p,pObj,pObj_00);
        }
        else {
          Dch_ManResimulateCex(p,pObj,pObj_00);
        }
        pAVar2 = Aig_ObjRepr(p->pAigTotal,pObj);
        if (pAVar2 == pObj_00) {
          __assert_fail("Aig_ObjRepr( p->pAigTotal, pObj ) != pObjRepr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/dch/dchSweep.c"
                        ,0x5c,"void Dch_ManSweepNode(Dch_Man_t *, Aig_Obj_t *)");
        }
      }
    }
  }
  return;
}

Assistant:

void Dch_ManSweepNode( Dch_Man_t * p, Aig_Obj_t * pObj )
{ 
    Aig_Obj_t * pObjRepr, * pObjFraig, * pObjFraig2, * pObjReprFraig;
    int RetValue;
    // get representative of this class
    pObjRepr = Aig_ObjRepr( p->pAigTotal, pObj );
    if ( pObjRepr == NULL )
        return;
    // get the fraiged node
    pObjFraig = Dch_ObjFraig( pObj );
    if ( pObjFraig == NULL )
        return;
    // get the fraiged representative
    pObjReprFraig = Dch_ObjFraig( pObjRepr );
    if ( pObjReprFraig == NULL )
        return;
    // if the fraiged nodes are the same, return
    if ( Aig_Regular(pObjFraig) == Aig_Regular(pObjReprFraig) )
    {
        // remember the proved equivalence
        p->pReprsProved[ pObj->Id ] = pObjRepr;
        return;
    }
    assert( Aig_Regular(pObjFraig) != Aig_ManConst1(p->pAigFraig) );
    RetValue = Dch_NodesAreEquiv( p, Aig_Regular(pObjReprFraig), Aig_Regular(pObjFraig) );
    if ( RetValue == -1 ) // timed out
    {
        Dch_ObjSetFraig( pObj, NULL );
        return;
    }
    if ( RetValue == 1 )  // proved equivalent
    {
        pObjFraig2 = Aig_NotCond( pObjReprFraig, pObj->fPhase ^ pObjRepr->fPhase );
        Dch_ObjSetFraig( pObj, pObjFraig2 );
        // remember the proved equivalence
        p->pReprsProved[ pObj->Id ] = pObjRepr;
        return;
    }
    // disproved the equivalence
    if ( p->pPars->fSimulateTfo )
        Dch_ManResimulateCex( p, pObj, pObjRepr );
    else
        Dch_ManResimulateCex2( p, pObj, pObjRepr );
    assert( Aig_ObjRepr( p->pAigTotal, pObj ) != pObjRepr );
}